

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<kj::String,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2])

{
  String *str;
  char (*value) [2];
  ArrayPtr<const_char> local_68;
  StringTree local_58;
  String *local_20;
  char (*params_local_1) [2];
  String *params_local;
  
  local_20 = params;
  params_local_1 = (char (*) [2])this;
  params_local = (String *)__return_storage_ptr__;
  str = fwd<kj::String>((NoInfer<kj::String> *)this);
  _::toStringTreeOrCharSequence(&local_58,str);
  value = ::const((char (*) [2])local_20);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value);
  StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,&local_58,(StringTree *)&local_68,
             (ArrayPtr<const_char> *)local_68.ptr);
  StringTree::~StringTree(&local_58);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}